

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall ON_MappingMeshInfo::GenerateDerivedData(ON_MappingMeshInfo *this)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int fi;
  long lVar6;
  int fi_1;
  int *piVar7;
  long lVar8;
  int sid;
  int nTotal;
  int local_40 [2];
  ON_SimpleArray<int> *local_38;
  
  piVar7 = (this->m_sourceIdFaceStart).m_a;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0,(long)(this->m_sourceIdFaceStart).m_capacity << 2);
  }
  (this->m_sourceIdFaceStart).m_count = 0;
  piVar7 = (this->m_sourceIdFaceCount).m_a;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0,(long)(this->m_sourceIdFaceCount).m_capacity << 2);
  }
  (this->m_sourceIdFaceCount).m_count = 0;
  piVar7 = (this->m_sourceIdFaceList).m_a;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0,(long)(this->m_sourceIdFaceList).m_capacity << 2);
  }
  (this->m_sourceIdFaceList).m_count = 0;
  local_38 = &this->m_sourceIdFaceList;
  for (lVar6 = 0; lVar6 < (this->m_faceSourceIds).m_count; lVar6 = lVar6 + 1) {
    iVar1 = (this->m_faceSourceIds).m_a[lVar6];
    if (-1 < (long)iVar1) {
      while ((this->m_sourceIdFaceCount).m_count <= iVar1) {
        local_40[1] = 0;
        ON_SimpleArray<int>::Append(&this->m_sourceIdFaceCount,local_40 + 1);
      }
      piVar7 = (this->m_sourceIdFaceCount).m_a + iVar1;
      *piVar7 = *piVar7 + 1;
    }
  }
  local_40[0] = 0;
  for (lVar6 = 0; lVar6 < (this->m_sourceIdFaceCount).m_count; lVar6 = lVar6 + 1) {
    ON_SimpleArray<int>::Append(&this->m_sourceIdFaceStart,local_40);
    local_40[0] = local_40[0] + (this->m_sourceIdFaceCount).m_a[lVar6];
  }
  ON_SimpleArray<int>::SetCapacity(local_38,(long)local_40[0]);
  uVar2 = (this->m_sourceIdFaceList).m_capacity;
  if (local_40[0] <= (int)uVar2 && -1 < local_40[0]) {
    (this->m_sourceIdFaceList).m_count = local_40[0];
  }
  piVar7 = (this->m_sourceIdFaceList).m_a;
  if (0 < (int)uVar2 && piVar7 != (int *)0x0) {
    memset(piVar7,0,(ulong)uVar2 << 2);
  }
  piVar7 = (this->m_sourceIdFaceCount).m_a;
  if (piVar7 == (int *)0x0) {
    piVar7 = (int *)0x0;
  }
  else {
    lVar6 = (long)(this->m_sourceIdFaceCount).m_capacity;
    if (0 < lVar6) {
      memset(piVar7,0,lVar6 << 2);
      piVar7 = (this->m_sourceIdFaceCount).m_a;
    }
  }
  piVar3 = (this->m_faceSourceIds).m_a;
  piVar4 = (this->m_sourceIdFaceStart).m_a;
  piVar5 = (this->m_sourceIdFaceList).m_a;
  for (lVar6 = 0; lVar6 < (this->m_faceSourceIds).m_count; lVar6 = lVar6 + 1) {
    lVar8 = (long)piVar3[lVar6];
    if (-1 < lVar8) {
      piVar5[(long)piVar7[lVar8] + (long)piVar4[lVar8]] = (int)lVar6;
      piVar7[lVar8] = piVar7[lVar8] + 1;
    }
  }
  return;
}

Assistant:

void ON_MappingMeshInfo::GenerateDerivedData()
{
  m_sourceIdFaceStart.Empty();
  m_sourceIdFaceCount.Empty();
  m_sourceIdFaceList.Empty();
  for (int fi = 0; fi < m_faceSourceIds.Count(); fi++)
  {
    const int sourceId = m_faceSourceIds[fi];
    if (sourceId >= 0)
    {
      while (m_sourceIdFaceCount.Count() <= sourceId)
      {
        m_sourceIdFaceCount.Append(0);
      }
      m_sourceIdFaceCount[sourceId]++;
    }
  }
  int nTotal = 0;
  for (int sid = 0; sid < m_sourceIdFaceCount.Count(); sid++)
  {
    m_sourceIdFaceStart.Append(nTotal);
    nTotal += m_sourceIdFaceCount[sid];
  }
  m_sourceIdFaceList.SetCapacity(nTotal);
  m_sourceIdFaceList.SetCount(nTotal);
  m_sourceIdFaceList.MemSet(0);
  m_sourceIdFaceCount.MemSet(0);
  for (int fi = 0; fi < m_faceSourceIds.Count(); fi++)
  {
    const int sourceId = m_faceSourceIds[fi];
    if (sourceId >= 0)
    {
      m_sourceIdFaceList[m_sourceIdFaceStart[sourceId] + m_sourceIdFaceCount[sourceId]] = fi;
      m_sourceIdFaceCount[sourceId]++;
    }
  }
}